

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetComponentTypeStr(xmlSchemaBasicItemPtr item)

{
  xmlSchemaBasicItemPtr item_local;
  
  if (item->type == XML_SCHEMA_TYPE_BASIC) {
    if ((item->type == XML_SCHEMA_TYPE_COMPLEX) || (item[10].type == 0x2d)) {
      item_local = (xmlSchemaBasicItemPtr)anon_var_dwarf_61772;
    }
    else {
      item_local = (xmlSchemaBasicItemPtr)0x27f4ee;
    }
  }
  else {
    item_local = (xmlSchemaBasicItemPtr)xmlSchemaItemTypeToStr(item->type);
  }
  return (xmlChar *)item_local;
}

Assistant:

static const xmlChar *
xmlSchemaGetComponentTypeStr(xmlSchemaBasicItemPtr item)
{
    switch (item->type) {
	case XML_SCHEMA_TYPE_BASIC:
	    if (WXS_IS_COMPLEX(WXS_TYPE_CAST item))
		return(BAD_CAST "complex type definition");
	    else
		return(BAD_CAST "simple type definition");
	default:
	    return(xmlSchemaItemTypeToStr(item->type));
    }
}